

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O2

xmlCharEncoding xmlDetectCharEncoding(uchar *in,int len)

{
  uchar uVar1;
  
  if (in == (uchar *)0x0) {
    return XML_CHAR_ENCODING_NONE;
  }
  if (len < 4) {
    if (len != 3) {
      if (len < 2) {
        return XML_CHAR_ENCODING_NONE;
      }
      uVar1 = *in;
      goto LAB_001426de;
    }
    uVar1 = *in;
  }
  else {
    uVar1 = *in;
    if (uVar1 == 'L') {
      if (in[1] != 'o') {
        return XML_CHAR_ENCODING_NONE;
      }
      if (in[2] == 0xa7) {
        if (in[3] == 0x94) {
          return XML_CHAR_ENCODING_EBCDIC;
        }
        return XML_CHAR_ENCODING_NONE;
      }
      return XML_CHAR_ENCODING_NONE;
    }
    if (uVar1 == '<') {
      if (in[1] == '?') {
        if (in[2] != 'x') {
          return XML_CHAR_ENCODING_NONE;
        }
        if (in[3] == 'm') {
          return XML_CHAR_ENCODING_UTF8;
        }
        return XML_CHAR_ENCODING_NONE;
      }
      if (in[1] != '\0') {
        return XML_CHAR_ENCODING_NONE;
      }
      if ((in[2] == '\0') && (in[3] == '\0')) {
        return XML_CHAR_ENCODING_UCS4LE;
      }
      if (in[2] != '?') {
        return XML_CHAR_ENCODING_NONE;
      }
      if (in[3] == '\0') {
        return XML_CHAR_ENCODING_UTF16LE;
      }
      return XML_CHAR_ENCODING_NONE;
    }
    if (uVar1 == '\0') {
      if (in[1] == '<') {
        if ((in[2] == '\0') && (in[3] == '\0')) {
          return XML_CHAR_ENCODING_UCS4_3412;
        }
        if (in[2] != '\0') {
          return XML_CHAR_ENCODING_NONE;
        }
        if (in[3] == '?') {
          return XML_CHAR_ENCODING_UTF16BE;
        }
        return XML_CHAR_ENCODING_NONE;
      }
      if (in[1] != '\0') {
        return XML_CHAR_ENCODING_NONE;
      }
      if ((in[2] == '\0') && (in[3] == '<')) {
        return XML_CHAR_ENCODING_UCS4BE;
      }
      if (in[2] != '<') {
        return XML_CHAR_ENCODING_NONE;
      }
      if (in[3] != '\0') {
        return XML_CHAR_ENCODING_NONE;
      }
      return XML_CHAR_ENCODING_UCS4_2143;
    }
  }
  if (uVar1 == 0xef) {
    if (in[1] != 0xbb) {
      return XML_CHAR_ENCODING_NONE;
    }
    if (in[2] == 0xbf) {
      return XML_CHAR_ENCODING_UTF8;
    }
    return XML_CHAR_ENCODING_NONE;
  }
LAB_001426de:
  if (uVar1 == 0xff) {
    if (in[1] == 0xfe) {
      return XML_CHAR_ENCODING_UTF16LE;
    }
    return XML_CHAR_ENCODING_NONE;
  }
  if ((uVar1 == 0xfe) && (in[1] == 0xff)) {
    return XML_CHAR_ENCODING_UTF16BE;
  }
  return XML_CHAR_ENCODING_NONE;
}

Assistant:

xmlCharEncoding
xmlDetectCharEncoding(const unsigned char* in, int len)
{
    if (in == NULL)
        return(XML_CHAR_ENCODING_NONE);
    if (len >= 4) {
	if ((in[0] == 0x00) && (in[1] == 0x00) &&
	    (in[2] == 0x00) && (in[3] == 0x3C))
	    return(XML_CHAR_ENCODING_UCS4BE);
	if ((in[0] == 0x3C) && (in[1] == 0x00) &&
	    (in[2] == 0x00) && (in[3] == 0x00))
	    return(XML_CHAR_ENCODING_UCS4LE);
	if ((in[0] == 0x00) && (in[1] == 0x00) &&
	    (in[2] == 0x3C) && (in[3] == 0x00))
	    return(XML_CHAR_ENCODING_UCS4_2143);
	if ((in[0] == 0x00) && (in[1] == 0x3C) &&
	    (in[2] == 0x00) && (in[3] == 0x00))
	    return(XML_CHAR_ENCODING_UCS4_3412);
	if ((in[0] == 0x4C) && (in[1] == 0x6F) &&
	    (in[2] == 0xA7) && (in[3] == 0x94))
	    return(XML_CHAR_ENCODING_EBCDIC);
	if ((in[0] == 0x3C) && (in[1] == 0x3F) &&
	    (in[2] == 0x78) && (in[3] == 0x6D))
	    return(XML_CHAR_ENCODING_UTF8);
	/*
	 * Although not part of the recommendation, we also
	 * attempt an "auto-recognition" of UTF-16LE and
	 * UTF-16BE encodings.
	 */
	if ((in[0] == 0x3C) && (in[1] == 0x00) &&
	    (in[2] == 0x3F) && (in[3] == 0x00))
	    return(XML_CHAR_ENCODING_UTF16LE);
	if ((in[0] == 0x00) && (in[1] == 0x3C) &&
	    (in[2] == 0x00) && (in[3] == 0x3F))
	    return(XML_CHAR_ENCODING_UTF16BE);
    }
    if (len >= 3) {
	/*
	 * Errata on XML-1.0 June 20 2001
	 * We now allow an UTF8 encoded BOM
	 */
	if ((in[0] == 0xEF) && (in[1] == 0xBB) &&
	    (in[2] == 0xBF))
	    return(XML_CHAR_ENCODING_UTF8);
    }
    /* For UTF-16 we can recognize by the BOM */
    if (len >= 2) {
	if ((in[0] == 0xFE) && (in[1] == 0xFF))
	    return(XML_CHAR_ENCODING_UTF16BE);
	if ((in[0] == 0xFF) && (in[1] == 0xFE))
	    return(XML_CHAR_ENCODING_UTF16LE);
    }
    return(XML_CHAR_ENCODING_NONE);
}